

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::HttpInputStreamImpl
          (HttpInputStreamImpl *this,AsyncInputStream *inner,HttpHeaderTable *table)

{
  (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).currentWrapper.
  ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_readRequest_0066cad0;
  this->inner = inner;
  heapArray<char>(&this->headerBuffer,0x1000);
  this->messageHeaderEnd = 0;
  (this->leftover).ptr = (char *)0x0;
  (this->leftover).size_ = 0;
  HttpHeaders::HttpHeaders(&this->headers,table);
  (this->resumingRequest).ptr.isSet = false;
  this->lineBreakBeforeNextHeader = false;
  this->broken = false;
  *(undefined8 *)&this->pendingMessageCount = 0;
  *(undefined8 *)((long)&(this->onMessageDone).ptr.disposer + 4) = 0;
  *(undefined4 *)((long)&(this->onMessageDone).ptr.ptr + 4) = 0;
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&this->messageReadQueue);
  return;
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner, const HttpHeaderTable& table)
      : inner(inner), headerBuffer(kj::heapArray<char>(MIN_BUFFER)), headers(table) {
  }